

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::InputScalarAsWidgetReplacement
               (ImRect *aabb,char *label,ImGuiDataType data_type,void *data_ptr,ImGuiID id,
               int decimal_precision)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImGuiContext *g;
  char buf [32];
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->Accessed = true;
  IVar3 = pIVar5->ScalarAsInputTextId;
  pIVar5->ActiveId = IVar3;
  pIVar5->ActiveIdIsJustActivated = true;
  pIVar5->ActiveIdAllowOverlap = false;
  if (IVar3 != 0) {
    pIVar5->ActiveIdIsAlive = true;
  }
  pIVar5->ActiveIdWindow = pIVar4;
  pIVar5->HoveredId = 0;
  pIVar5->HoveredIdAllowOverlap = false;
  uVar1 = pIVar4->FocusIdxAllCounter;
  uVar2 = pIVar4->FocusIdxTabCounter;
  pIVar4->FocusIdxAllCounter = uVar1 + -1;
  pIVar4->FocusIdxTabCounter = uVar2 + -1;
  if (data_type == ImGuiDataType_Float) {
    if (decimal_precision < 0) {
      ImFormatString(buf,0x20,"%f",(double)*data_ptr);
    }
    else {
      ImFormatString(buf,0x20,"%.*f",(double)*data_ptr,decimal_precision);
    }
  }
  else if (data_type == ImGuiDataType_Int) {
    if (decimal_precision < 0) {
      ImFormatString(buf,0x20,"%d",(ulong)*data_ptr);
    }
    else {
      ImFormatString(buf,0x20,"%.*d",decimal_precision);
    }
  }
  local_38.x = (aabb->Max).x - (aabb->Min).x;
  local_38.y = (aabb->Max).y - (aabb->Min).y;
  bVar6 = InputTextEx(label,buf,0x20,&local_38,0x11,(ImGuiTextEditCallback)0x0,(void *)0x0);
  if (pIVar5->ScalarAsInputTextId == 0) {
    if (pIVar5->ActiveId != id) {
      __assert_fail("g.ActiveId == id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0x18cd,
                    "bool ImGui::InputScalarAsWidgetReplacement(const ImRect &, const char *, ImGuiDataType, void *, ImGuiID, int)"
                   );
    }
    pIVar5->ScalarAsInputTextId = id;
    pIVar5 = GImGui;
    GImGui->HoveredId = id;
    pIVar5->HoveredIdAllowOverlap = false;
  }
  else if (pIVar5->ActiveId != pIVar5->ScalarAsInputTextId) {
    pIVar5->ScalarAsInputTextId = 0;
  }
  if (bVar6) {
    bVar6 = DataTypeApplyOpFromText
                      (buf,(GImGui->InputTextState).InitialText.Data,data_type,data_ptr,(char *)0x0)
    ;
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ImGui::InputScalarAsWidgetReplacement(const ImRect& aabb, const char* label, ImGuiDataType data_type, void* data_ptr, ImGuiID id, int decimal_precision)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Our replacement widget will override the focus ID (registered previously to allow for a TAB focus to happen)
    SetActiveID(g.ScalarAsInputTextId, window);
    SetHoveredID(0);
    FocusableItemUnregister(window);

    char buf[32];
    DataTypeFormatString(data_type, data_ptr, decimal_precision, buf, IM_ARRAYSIZE(buf));
    bool text_value_changed = InputTextEx(label, buf, IM_ARRAYSIZE(buf), aabb.GetSize(), ImGuiInputTextFlags_CharsDecimal | ImGuiInputTextFlags_AutoSelectAll);
    if (g.ScalarAsInputTextId == 0)
    {
        // First frame
        IM_ASSERT(g.ActiveId == id);    // InputText ID expected to match the Slider ID (else we'd need to store them both, which is also possible)
        g.ScalarAsInputTextId = g.ActiveId;
        SetHoveredID(id);
    }
    else if (g.ActiveId != g.ScalarAsInputTextId)
    {
        // Release
        g.ScalarAsInputTextId = 0;
    }
    if (text_value_changed)
        return DataTypeApplyOpFromText(buf, GImGui->InputTextState.InitialText.begin(), data_type, data_ptr, NULL);
    return false;
}